

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Expr * __thiscall parser::Parser::mkNode(Parser *this,Operator *op,Expr *e1,Expr *e2)

{
  TokenType TVar1;
  pointer pcVar2;
  undefined *puVar3;
  UniaryOp *this_00;
  ostream *poVar4;
  _Alloc_hider _Var5;
  ostringstream message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [16];
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined1 local_358 [16];
  _Alloc_hider local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  undefined1 local_328 [16];
  _Alloc_hider local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f8 [16];
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined1 local_2c8 [16];
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [16];
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [16];
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [16];
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [16];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  TVar1 = (op->super_Token).Type;
  switch(TVar1) {
  case EQ:
    this_00 = (UniaryOp *)operator_new(0x58);
    local_358._0_8_ = &PTR__Token_001788a0;
    pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
    local_358._8_4_ = TVar1;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
    ast::Equals::Equals((Equals *)this_00,(Token *)local_358,this->l->line);
    local_358._0_8_ = &PTR__Token_001788a0;
    local_308._M_allocated_capacity = local_338._M_allocated_capacity;
    _Var5._M_p = local_348._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
LAB_00124e1d:
      operator_delete(_Var5._M_p,local_308._M_allocated_capacity + 1);
    }
    break;
  case NOT_EQ:
    this_00 = (UniaryOp *)operator_new(0x58);
    ast::NotEquals::NotEquals((NotEquals *)this_00,&op->super_Token,this->l->line);
    break;
  case GT:
    this_00 = (UniaryOp *)operator_new(0x58);
    local_2f8._0_8_ = &PTR__Token_001788a0;
    pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
    local_2f8._8_4_ = TVar1;
    local_2e8._M_p = (pointer)&local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
    ast::GreaterThan::GreaterThan((GreaterThan *)this_00,(Token *)local_2f8,this->l->line);
    local_2f8._0_8_ = &PTR__Token_001788a0;
    local_308._M_allocated_capacity = local_2d8._M_allocated_capacity;
    _Var5._M_p = local_2e8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_p != &local_2d8) goto LAB_00124e1d;
    break;
  case LT:
    this_00 = (UniaryOp *)operator_new(0x58);
    local_298._0_8_ = &PTR__Token_001788a0;
    pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
    local_298._8_4_ = TVar1;
    local_288._M_p = (pointer)&local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
    ast::LessThan::LessThan((LessThan *)this_00,(Token *)local_298,this->l->line);
    local_298._0_8_ = &PTR__Token_001788a0;
    local_308._M_allocated_capacity = local_278._M_allocated_capacity;
    _Var5._M_p = local_288._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_p != &local_278) goto LAB_00124e1d;
    break;
  case COMMA:
switchD_001247f1_caseD_108:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"couldn\'t parse operator type ",0x1d);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(op->symbol)._M_dataplus._M_p,
                        (op->symbol)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    this_00 = (UniaryOp *)0x0;
    goto LAB_00124e2d;
  case ASSIGN:
    this_00 = (UniaryOp *)operator_new(0x58);
    local_388._0_8_ = &PTR__Token_001788a0;
    pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
    local_388._8_4_ = TVar1;
    local_378._M_p = (pointer)&local_368;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_378,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
    ast::Assign::Assign((Assign *)this_00,(Token *)local_388,this->l->line);
    local_388._0_8_ = &PTR__Token_001788a0;
    local_308._M_allocated_capacity = local_368._M_allocated_capacity;
    _Var5._M_p = local_378._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_p != &local_368) goto LAB_00124e1d;
    break;
  case PLUS:
    this_00 = (UniaryOp *)operator_new(0x58);
    local_1d8._0_8_ = &PTR__Token_001788a0;
    pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
    local_1d8._8_4_ = TVar1;
    local_1c8._M_p = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
    ast::Add::Add((Add *)this_00,(Token *)local_1d8,this->l->line);
    local_1d8._0_8_ = &PTR__Token_001788a0;
    local_308._M_allocated_capacity = local_1b8._M_allocated_capacity;
    _Var5._M_p = local_1c8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_p != &local_1b8) goto LAB_00124e1d;
    break;
  case MINUS:
    this_00 = (UniaryOp *)operator_new(0x58);
    local_238._0_8_ = &PTR__Token_001788a0;
    pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
    local_238._8_4_ = TVar1;
    local_228._M_p = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
    ast::Sub::Sub((Sub *)this_00,(Token *)local_238,this->l->line);
    local_238._0_8_ = &PTR__Token_001788a0;
    local_308._M_allocated_capacity = local_218._M_allocated_capacity;
    _Var5._M_p = local_228._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != &local_218) goto LAB_00124e1d;
    break;
  case BANG:
    this_00 = (UniaryOp *)operator_new(0x50);
    ast::UniaryOp::UniaryOp(this_00,&op->super_Token,4,1,this->l->line);
    puVar3 = &ast::Not::vtable;
LAB_00124e91:
    (((BinaryOp *)&this_00->super_Op)->super_Op).super_Expr.super_Node._vptr_Node =
         (_func_int **)(puVar3 + 0x10);
    goto LAB_00124e29;
  case ASTERISK:
    this_00 = (UniaryOp *)operator_new(0x58);
    local_208._0_8_ = &PTR__Token_001788a0;
    pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
    local_208._8_4_ = TVar1;
    local_1f8._M_p = (pointer)&local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
    ast::Mult::Mult((Mult *)this_00,(Token *)local_208,this->l->line);
    local_208._0_8_ = &PTR__Token_001788a0;
    local_308._M_allocated_capacity = local_1e8._M_allocated_capacity;
    _Var5._M_p = local_1f8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_p != &local_1e8) goto LAB_00124e1d;
    break;
  case DIV:
    this_00 = (UniaryOp *)operator_new(0x58);
    local_268._0_8_ = &PTR__Token_001788a0;
    pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
    local_268._8_4_ = TVar1;
    local_258._M_p = (pointer)&local_248;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
    ast::Div::Div((Div *)this_00,(Token *)local_268,this->l->line);
    local_268._0_8_ = &PTR__Token_001788a0;
    local_308._M_allocated_capacity = local_248._M_allocated_capacity;
    _Var5._M_p = local_258._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_p != &local_248) goto LAB_00124e1d;
    break;
  default:
    switch(TVar1) {
    case LT_EQ:
      this_00 = (UniaryOp *)operator_new(0x58);
      local_2c8._0_8_ = &PTR__Token_001788a0;
      pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
      local_2c8._8_4_ = TVar1;
      local_2b8._M_p = (pointer)&local_2a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
      ast::LessThanOrEqual::LessThanOrEqual
                ((LessThanOrEqual *)this_00,(Token *)local_2c8,this->l->line);
      local_2c8._0_8_ = &PTR__Token_001788a0;
      local_308._M_allocated_capacity = local_2a8._M_allocated_capacity;
      _Var5._M_p = local_2b8._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_p != &local_2a8) goto LAB_00124e1d;
      break;
    case UMINUS:
      this_00 = (UniaryOp *)operator_new(0x50);
      ast::UniaryOp::UniaryOp(this_00,&op->super_Token,4,0,this->l->line);
      puVar3 = &ast::UniarySub::vtable;
      goto LAB_00124e91;
    case GT_EQ:
      this_00 = (UniaryOp *)operator_new(0x58);
      local_328._0_8_ = &PTR__Token_001788a0;
      pcVar2 = (op->super_Token).Literal._M_dataplus._M_p;
      local_328._8_4_ = TVar1;
      local_318._M_p = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,pcVar2,pcVar2 + (op->super_Token).Literal._M_string_length);
      ast::GreaterThanOrEqual::GreaterThanOrEqual
                ((GreaterThanOrEqual *)this_00,(Token *)local_328,this->l->line);
      local_328._0_8_ = &PTR__Token_001788a0;
      _Var5._M_p = local_318._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != &local_308) goto LAB_00124e1d;
      break;
    default:
      goto switchD_001247f1_caseD_108;
    case CALL:
      this_00 = (UniaryOp *)__dynamic_cast(e2,&ast::Expr::typeinfo,&ast::CallExpression::typeinfo,0)
      ;
      *(Expr **)&(((BinaryOp *)&this_00->super_Op)->super_Op).precedence = e1;
      goto LAB_00124e2d;
    }
  }
  this_00[1].super_Op.super_Expr.super_Node._vptr_Node = (_func_int **)e1;
LAB_00124e29:
  this_00->RightOp = e2;
LAB_00124e2d:
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return (Expr *)this_00;
}

Assistant:

Expr* Parser::mkNode(Operator& op, Expr* e1, Expr* e2)
{
    std::ostringstream message;
    switch (op.Type) {
        case TokenType::PLUS:
             {
              auto add = new Add(op, l->line);
              add->LeftOp = e1;
              add->RightOp = e2;
              return add;
             }
        case TokenType::ASTERISK:
             {
              auto mul = new Mult(op, l->line);
              mul->LeftOp = e1;
              mul->RightOp = e2;
              return mul;
             }
        case TokenType::MINUS:
           {
             auto sub = new Sub(op, l->line);
             sub->LeftOp = e1;
             sub->RightOp = e2;
             return sub;
           }
        case TokenType::UMINUS:
           {
             auto usub = new UniarySub(op, l->line);
             usub->RightOp = e2;
             return usub;
           }
        case TokenType::BANG:
          {
             auto nt = new Not(op, l->line);
             nt->RightOp = e2;
             return nt;
          }
        case TokenType::DIV:
          {
            auto div = new Div(op, l->line);
            div->LeftOp = e1;
            div->RightOp = e2;
            return div;
          }
         case TokenType::LT:
         {
             auto lt = new LessThan(op, l->line);
             lt->LeftOp = e1;
             lt->RightOp = e2;
             return lt;
         }
         case TokenType::LT_EQ:
          {
             auto lt_eq = new LessThanOrEqual(op, l->line);
             lt_eq->LeftOp = e1;
             lt_eq->RightOp = e2;
             return lt_eq;
          }
          case TokenType::GT:
           {
              auto gt = new GreaterThan(op, l->line);
              gt->LeftOp = e1;
              gt->RightOp = e2;
              return gt;
           }
           case TokenType::GT_EQ:
            {
               auto gt_eq = new GreaterThanOrEqual(op, l->line);
               gt_eq->LeftOp = e1;
               gt_eq->RightOp = e2;
               return gt_eq;
            }
            case TokenType::NOT_EQ:
             {
                auto nt_eq = new NotEquals(op, l->line);
                nt_eq->LeftOp = e1;
                nt_eq->RightOp = e2;
                return nt_eq;
             }
            case TokenType::EQ:
            {
               auto eq = new Equals(op, l->line);
               eq->LeftOp = e1;
               eq->RightOp = e2;
               return eq;
            }
            case TokenType::ASSIGN:
            {
               auto assign = new Assign(op, l->line);
               assign->LeftOp = e1;
               assign->RightOp = e2;
               return assign;
            }
            case TokenType::CALL:
             {
               auto call = dynamic_cast<CallExpression*>(e2);
               call->function = e1;
               return call;
             }
        default:
             message << "couldn't parse operator type " << op.symbol
                   << endl;
             errors.push_back(message.str());
             return nullptr;
    }
}